

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::access_chain_needs_stage_io_builtin_translation
          (CompilerMSL *this,uint32_t base)

{
  bool bVar1;
  bool bVar2;
  SPIRVariable *pSVar3;
  
  pSVar3 = Compiler::maybe_get_backing_variable((Compiler *)this,base);
  bVar2 = true;
  if (pSVar3 != (SPIRVariable *)0x0) {
    bVar1 = Compiler::is_tessellation_shader((Compiler *)this);
    if (bVar1) {
      bVar2 = is_tese_shader(this);
      if (bVar2) {
        bVar2 = pSVar3->storage == StorageClassOutput;
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool CompilerMSL::access_chain_needs_stage_io_builtin_translation(uint32_t base)
{
	auto *var = maybe_get_backing_variable(base);
	if (!var || !is_tessellation_shader())
		return true;

	// We only need to rewrite builtin access chains when accessing flattened builtins like gl_ClipDistance_N.
	// Avoid overriding it back to just gl_ClipDistance.
	// This can only happen in scenarios where we cannot flatten/unflatten access chains, so, the only case
	// where this triggers is evaluation shader inputs.
	bool redirect_builtin = is_tese_shader() ? var->storage == StorageClassOutput : false;
	return redirect_builtin;
}